

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArraySampling.cpp
# Opt level: O0

int __thiscall
glcts::TextureCubeMapArraySamplingTest::programDefinition::init
          (programDefinition *this,EVP_PKEY_CTX *ctx)

{
  GLuint GVar1;
  deUint32 err;
  int iVar2;
  InternalError *this_00;
  undefined4 in_ECX;
  undefined8 *in_RDX;
  byte in_R8B;
  bool bVar3;
  bool is_program_defined;
  bool isContextES_local;
  shaderType shader_type_local;
  shaderGroup *shader_group_local;
  Functions *gl_local;
  programDefinition *this_local;
  
  this->m_gl = (Functions *)ctx;
  bVar3 = false;
  switch(in_ECX) {
  case 0:
    this->compute_shader = (shaderDefinition *)in_RDX[4];
    bVar3 = this->compute_shader != (shaderDefinition *)0x0;
    break;
  case 1:
    this->fragment_shader = (shaderDefinition *)in_RDX[5];
    this->vertex_shader = (shaderDefinition *)in_RDX[3];
    bVar3 = false;
    if (this->fragment_shader != (shaderDefinition *)0x0) {
      bVar3 = this->vertex_shader != (shaderDefinition *)0x0;
    }
    break;
  case 2:
    this->fragment_shader = (shaderDefinition *)*in_RDX;
    this->geometry_shader = (shaderDefinition *)in_RDX[6];
    this->vertex_shader = (shaderDefinition *)in_RDX[3];
    bVar3 = false;
    if ((this->fragment_shader != (shaderDefinition *)0x0) &&
       (bVar3 = false, this->geometry_shader != (shaderDefinition *)0x0)) {
      bVar3 = this->vertex_shader != (shaderDefinition *)0x0;
    }
    break;
  case 3:
    this->fragment_shader = (shaderDefinition *)*in_RDX;
    this->tesselation_control_shader = (shaderDefinition *)in_RDX[7];
    this->tesselation_evaluation_shader = (shaderDefinition *)in_RDX[2];
    this->vertex_shader = (shaderDefinition *)in_RDX[3];
    bVar3 = false;
    if (((this->fragment_shader != (shaderDefinition *)0x0) &&
        (bVar3 = false, this->tesselation_control_shader != (shaderDefinition *)0x0)) &&
       (bVar3 = false, this->tesselation_evaluation_shader != (shaderDefinition *)0x0)) {
      bVar3 = this->vertex_shader != (shaderDefinition *)0x0;
    }
    break;
  case 4:
    this->fragment_shader = (shaderDefinition *)*in_RDX;
    if ((in_R8B & 1) != 0) {
      this->tesselation_control_shader = (shaderDefinition *)in_RDX[1];
    }
    this->tesselation_evaluation_shader = (shaderDefinition *)in_RDX[8];
    this->vertex_shader = (shaderDefinition *)in_RDX[3];
    bVar3 = false;
    if (((this->fragment_shader != (shaderDefinition *)0x0) &&
        (bVar3 = false, this->tesselation_control_shader != (shaderDefinition *)0x0)) &&
       (bVar3 = false, this->tesselation_evaluation_shader != (shaderDefinition *)0x0)) {
      bVar3 = this->vertex_shader != (shaderDefinition *)0x0;
    }
    break;
  case 5:
    this->fragment_shader = (shaderDefinition *)*in_RDX;
    this->vertex_shader = (shaderDefinition *)in_RDX[9];
    bVar3 = false;
    if (this->fragment_shader != (shaderDefinition *)0x0) {
      bVar3 = this->vertex_shader != (shaderDefinition *)0x0;
    }
  }
  iVar2 = 1;
  if (bVar3) {
    GVar1 = (*this->m_gl->createProgram)();
    this->m_program_object_id = GVar1;
    err = (**(code **)(ctx + 0x800))();
    glu::checkError(err,"Failed to create program",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                    ,0x1194);
    iVar2 = 0;
    if (this->m_program_object_id == 0) {
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_00,"glCreateProgram return invalid id","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArraySampling.cpp"
                 ,0x1198);
      __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
  }
  return iVar2;
}

Assistant:

void TextureCubeMapArraySamplingTest::programDefinition::init(const glw::Functions& gl, const shaderGroup& shader_group,
															  shaderType shader_type, bool isContextES)
{
	m_gl = &gl;

	bool is_program_defined = false;

	switch (shader_type)
	{
	case Compute:
		compute_shader	 = shader_group.sampling_compute_shader;
		is_program_defined = (0 != compute_shader);
		break;
	case Fragment:
		fragment_shader	= shader_group.sampling_fragment_shader;
		vertex_shader	  = shader_group.pass_through_vertex_shader;
		is_program_defined = ((0 != fragment_shader) && (0 != vertex_shader));
		break;
	case Geometry:
		fragment_shader	= shader_group.pass_through_fragment_shader;
		geometry_shader	= shader_group.sampling_geometry_shader;
		vertex_shader	  = shader_group.pass_through_vertex_shader;
		is_program_defined = ((0 != fragment_shader) && (0 != geometry_shader) && (0 != vertex_shader));
		break;
	case Tesselation_Control:
		fragment_shader				  = shader_group.pass_through_fragment_shader;
		tesselation_control_shader	= shader_group.sampling_tesselation_control_shader;
		tesselation_evaluation_shader = shader_group.pass_through_tesselation_evaluation_shader;
		vertex_shader				  = shader_group.pass_through_vertex_shader;
		is_program_defined			  = ((0 != fragment_shader) && (0 != tesselation_control_shader) &&
							  (0 != tesselation_evaluation_shader) && (0 != vertex_shader));
		break;
	case Tesselation_Evaluation:
		fragment_shader = shader_group.pass_through_fragment_shader;
		if (isContextES)
		{
			tesselation_control_shader = shader_group.pass_through_tesselation_control_shader;
		}
		tesselation_evaluation_shader = shader_group.sampling_tesselation_evaluation_shader;
		vertex_shader				  = shader_group.pass_through_vertex_shader;
		is_program_defined			  = ((0 != fragment_shader) && (0 != tesselation_control_shader) &&
							  (0 != tesselation_evaluation_shader) && (0 != vertex_shader));
		break;
	case Vertex:
		fragment_shader	= shader_group.pass_through_fragment_shader;
		vertex_shader	  = shader_group.sampling_vertex_shader;
		is_program_defined = ((0 != fragment_shader) && (0 != vertex_shader));
		break;
	}

	if (true == is_program_defined)
	{
		m_program_object_id = m_gl->createProgram();

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create program");

		if (m_invalid_program_object_id == m_program_object_id)
		{
			throw tcu::InternalError("glCreateProgram return invalid id", "", __FILE__, __LINE__);
		}
	}
}